

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_60 [23];
  Voidify local_49;
  string *local_48;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_38;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  string *local_18;
  string *absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  iVar1 = size(this);
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar1);
  iVar2 = allocated_size(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  local_18 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"size() <= allocated_size()");
  if (local_18 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    local_38 = auVar4._8_8_;
    absl_log_internal_check_op_result_1 = auVar4._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x25f,absl_log_internal_check_op_result_1,local_38);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  iVar1 = allocated_size(this);
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar1);
  iVar2 = Capacity(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  local_48 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"allocated_size() <= Capacity()");
  if (local_48 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x260,auVar4._0_8_,auVar4._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_60);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_49,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
  }
  iVar1 = this->current_size_;
  iVar2 = Capacity(this);
  return iVar2 <= iVar1;
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }